

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_compute_color_stats
               (LodePNGColorStats *stats,uchar *in,uint w,uint h,LodePNGColorMode *mode_in)

{
  undefined2 uVar1;
  undefined2 uVar2;
  LodePNGColorType LVar3;
  byte bVar4;
  uchar a_00;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  LodePNGColorMode *mode;
  LodePNGColorStats *pLVar12;
  uint uVar13;
  ulong uVar14;
  size_t sVar15;
  byte bVar16;
  bool bVar17;
  bool bVar18;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  unsigned_short a;
  uint local_114;
  byte local_10d;
  uchar local_10c;
  byte local_10b;
  byte local_10a;
  byte local_109;
  uint local_108;
  uint local_104;
  LodePNGColorMode *local_100;
  size_t local_f8;
  LodePNGColorStats *local_f0;
  uchar *local_e8;
  uint local_e0;
  uint local_dc;
  ulong local_d8;
  size_t local_d0;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  ColorTree tree;
  
  local_f8 = (ulong)h * (ulong)w;
  LVar3 = mode_in->colortype;
  local_e8 = in;
  local_114 = lodepng_can_have_alpha(mode_in);
  local_114 = local_114 ^ 1;
  local_100 = mode_in;
  local_104 = lodepng_get_bpp(mode_in);
  uVar5 = stats->bits;
  local_d0 = CONCAT71(local_d0._1_7_,local_104 == 1 && uVar5 == 1);
  local_c4 = 0x101;
  if ((local_104 < 9) &&
     (local_c4 = (1 << ((byte)local_104 & 0x1f)) + stats->numcolors, 0x100 < local_c4)) {
    local_c4 = 0x101;
  }
  bVar16 = (LVar3 & ~LCT_GREY_ALPHA) == LCT_GREY;
  stats->numpixels = stats->numpixels + local_f8;
  uVar13 = stats->allow_palette;
  color_tree_init(&tree);
  if (stats->alpha != 0) {
    local_114 = 1;
  }
  uVar11 = stats->colored;
  local_10d = local_104 <= uVar5;
  local_d8 = (ulong)stats->numcolors;
  bVar17 = (uVar5 == 0x10 || uVar13 == 0) || local_c4 <= stats->numcolors;
  local_f0 = stats;
  if (bVar17) {
LAB_0011a9a2:
    mode = local_100;
    bVar4 = local_10d;
    uVar5 = (uint)(uVar11 != 0 | bVar16);
    if (local_100->bitdepth == 0x10) {
      r = 0;
      g = 0;
      b = 0;
      a = 0;
      sVar15 = 0;
      do {
        if (local_f8 == sVar15) goto LAB_0011ac4d;
        getPixelColorRGBA16(&r,&g,&b,&a,local_e8,sVar15,mode);
        pLVar12 = local_f0;
      } while ((((r & 0xff) == r >> 8) && ((g & 0xff) == g >> 8)) &&
              (((b & 0xff) == b >> 8 && (sVar15 = sVar15 + 1, (a & 0xff) == a >> 8))));
      local_f0->bits = 0x10;
      r = 0;
      g = 0;
      b = 0;
      a = 0;
      sVar15 = 0;
      do {
        if (local_f8 == sVar15) break;
        getPixelColorRGBA16(&r,&g,&b,&a,local_e8,sVar15,mode);
        bVar16 = 1;
        bVar17 = uVar5 == 0;
        uVar5 = 1;
        if (bVar17) {
          if (r == g) {
            bVar16 = 0;
            uVar5 = 0;
            if (r == b) goto LAB_0011aae7;
          }
          pLVar12->colored = 1;
          bVar16 = 1;
          uVar5 = 1;
        }
LAB_0011aae7:
        if (local_114 == 0) {
          if ((r == pLVar12->key_r) && (g == pLVar12->key_g)) {
            bVar17 = b == pLVar12->key_b;
          }
          else {
            bVar17 = false;
          }
          if (a == 0xffff) {
            bVar4 = 0;
            local_114 = 0;
            if ((bool)(pLVar12->key != 0 & bVar17)) goto LAB_0011ab95;
          }
          else {
            if ((a != 0) || (!(bool)(pLVar12->key == 0 | bVar17))) {
LAB_0011ab95:
              pLVar12->alpha = 1;
              pLVar12->key = 0;
              goto LAB_0011aba4;
            }
            bVar4 = 0;
            local_114 = 0;
            if (pLVar12->key == 0 && pLVar12->alpha == 0) {
              pLVar12->key = 1;
              pLVar12->key_r = r;
              pLVar12->key_g = g;
              pLVar12->key_b = b;
              bVar4 = 0;
              local_114 = 0;
            }
          }
        }
        else {
LAB_0011aba4:
          bVar4 = 1;
          local_114 = 1;
        }
        sVar15 = sVar15 + 1;
      } while (!(bool)(bVar16 & bVar4));
      if ((pLVar12->key != 0) && (pLVar12->alpha == 0)) {
        for (sVar15 = 0; local_f8 != sVar15; sVar15 = sVar15 + 1) {
          getPixelColorRGBA16(&r,&g,&b,&a,local_e8,sVar15,local_100);
          if ((((a != 0) && (r == pLVar12->key_r)) && (g == pLVar12->key_g)) &&
             (b == pLVar12->key_b)) {
            pLVar12->alpha = 1;
            pLVar12->key = 0;
          }
        }
      }
    }
    else {
LAB_0011ac4d:
      sVar15 = 0;
      r = r & 0xff00;
      g = g & 0xff00;
      b = b & 0xff00;
      a = a & 0xff00;
      pLVar12 = local_f0;
      bVar16 = bVar4 | (byte)local_d0;
      uVar13 = local_104;
      do {
        if (local_f8 == sVar15) break;
        local_d0 = sVar15;
        getPixelColorRGBA8((uchar *)&r,(uchar *)&g,(uchar *)&b,(uchar *)&a,local_e8,sVar15,mode);
        uVar11 = pLVar12->bits;
        if ((bVar16 & 1) == 0 && uVar11 < 8) {
          uVar6 = 1;
          if ((1 < (byte)((byte)r + 1)) && (uVar6 = 8, (byte)r % 0x11 == 0)) {
            uVar6 = (uint)((byte)r % 0x55 != 0) * 2 + 2;
          }
          if (uVar11 < uVar6) {
            pLVar12->bits = uVar6;
            uVar11 = uVar6;
          }
        }
        local_10d = uVar13 <= uVar11;
        uVar14 = CONCAT71((int7)(sVar15 >> 8),1);
        bVar10 = 1;
        uVar6 = 1;
        bVar4 = (byte)g;
        bVar16 = (byte)b;
        uVar7 = uVar11;
        if (uVar5 == 0) {
          if ((byte)r == (byte)g) {
            bVar10 = 0;
            uVar6 = 0;
            if ((byte)r == (byte)b) goto LAB_0011ad73;
          }
          pLVar12->colored = 1;
          bVar10 = 1;
          uVar6 = 1;
          if (uVar11 < 8) {
            pLVar12->bits = 8;
            uVar7 = 8;
            bVar10 = 1;
          }
        }
LAB_0011ad73:
        a_00 = (uchar)a;
        if (local_114 == 0) {
          if ((pLVar12->key_r == (r & 0xff)) && (pLVar12->key_g == (g & 0xff))) {
            bVar18 = pLVar12->key_b == (b & 0xff);
          }
          else {
            bVar18 = false;
          }
          if ((uchar)a == 0xff) {
            uVar14 = 0;
            local_114 = 0;
            if ((bool)(pLVar12->key != 0 & bVar18)) {
              pLVar12->alpha = 1;
              pLVar12->key = 0;
              if (uVar7 < 8) goto LAB_0011afc3;
              goto LAB_0011ad7a;
            }
          }
          else {
            if (((uchar)a != '\0') || (!(bool)(pLVar12->key == 0 | bVar18))) {
              pLVar12->alpha = 1;
              pLVar12->key = 0;
              if (uVar7 < 8) {
LAB_0011afc3:
                pLVar12->bits = 8;
                goto LAB_0011ad7a;
              }
              goto LAB_0011ad7d;
            }
            uVar14 = 0;
            local_114 = 0;
            if (pLVar12->key == 0 && pLVar12->alpha == 0) {
              pLVar12->key = 1;
              pLVar12->key_r = r & 0xff;
              pLVar12->key_g = g & 0xff;
              pLVar12->key_b = b & 0xff;
              uVar14 = 0;
              local_114 = 0;
            }
          }
        }
        else {
LAB_0011ad7a:
          uVar14 = CONCAT71((int7)(uVar14 >> 8),1);
LAB_0011ad7d:
          local_114 = 1;
        }
        if (bVar17) {
          bVar17 = true;
          uVar5 = uVar6;
        }
        else {
          local_e0 = (uint)uVar14;
          local_109 = (byte)r;
          local_c0 = (uint)(byte)g;
          local_bc = (uint)(byte)r;
          local_108 = uVar6;
          local_dc = uVar11;
          iVar8 = color_tree_get(&tree,(byte)r,(byte)g,(byte)b,(uchar)a);
          if (iVar8 < 0) {
            local_10c = a_00;
            local_10b = bVar16;
            local_10a = bVar4;
            uVar5 = color_tree_add(&tree,(uchar)local_bc,(uchar)local_c0,bVar16,a_00,(uint)local_d8)
            ;
            if (uVar5 != 0) goto LAB_0011b005;
            uVar5 = local_f0->numcolors;
            uVar14 = (ulong)local_e0;
            if ((ulong)uVar5 < 0x100) {
              uVar9 = (ulong)(uVar5 * 4);
              local_f0->palette[(ulong)uVar5 * 4] = local_109;
              local_f0->palette[uVar9 + 1] = local_10a;
              local_f0->palette[uVar9 + 2] = local_10b;
              local_f0->palette[uVar9 + 3] = local_10c;
            }
            uVar5 = uVar5 + 1;
            local_d8 = (ulong)uVar5;
            local_f0->numcolors = uVar5;
            bVar17 = local_c4 <= uVar5;
            mode = local_100;
            pLVar12 = local_f0;
            uVar13 = local_104;
            uVar11 = local_dc;
            uVar5 = local_108;
          }
          else {
            bVar17 = false;
            uVar14 = (ulong)local_e0;
            mode = local_100;
            pLVar12 = local_f0;
            uVar13 = local_104;
            uVar11 = local_dc;
            uVar5 = local_108;
          }
        }
        sVar15 = local_d0 + 1;
        bVar16 = local_10d;
      } while (((bVar10 & (byte)uVar14 & bVar17) != 1) || (uVar11 < uVar13));
      if ((pLVar12->key != 0) && (pLVar12->alpha == 0)) {
        for (sVar15 = 0; local_f8 != sVar15; sVar15 = sVar15 + 1) {
          getPixelColorRGBA8((uchar *)&r,(uchar *)&g,(uchar *)&b,(uchar *)&a,local_e8,sVar15,
                             local_100);
          if (((((uchar)a != '\0') && (pLVar12->key_r == (r & 0xff))) &&
              (pLVar12->key_g == (g & 0xff))) && (pLVar12->key_b == (b & 0xff))) {
            pLVar12->alpha = 1;
            pLVar12->key = 0;
            if (pLVar12->bits < 8) {
              pLVar12->bits = 8;
            }
          }
        }
      }
      uVar1 = pLVar12->key_r;
      uVar2 = pLVar12->key_g;
      pLVar12->key_r = uVar1 * 0x101;
      pLVar12->key_g = uVar2 * 0x101;
      pLVar12->key_b = (short)*(undefined4 *)&pLVar12->key_b * 0x101;
    }
    uVar5 = 0;
  }
  else {
    local_108 = CONCAT31(local_108._1_3_,bVar16);
    uVar14 = 0;
    do {
      if (stats->numcolors <= uVar14) {
        bVar16 = (byte)local_108;
        local_d8 = (ulong)stats->numcolors;
        goto LAB_0011a9a2;
      }
      uVar5 = color_tree_add(&tree,stats->palette[uVar14 * 4],stats->palette[uVar14 * 4 + 1],
                             stats->palette[uVar14 * 4 + 2],stats->palette[uVar14 * 4 + 3],
                             (uint)uVar14);
      uVar14 = uVar14 + 1;
    } while (uVar5 == 0);
  }
LAB_0011b005:
  color_tree_cleanup(&tree);
  return uVar5;
}

Assistant:

unsigned lodepng_compute_color_stats(LodePNGColorStats* stats,
                                     const unsigned char* in, unsigned w, unsigned h,
                                     const LodePNGColorMode* mode_in) {
  size_t i;
  ColorTree tree;
  size_t numpixels = (size_t)w * (size_t)h;
  unsigned error = 0;

  /* mark things as done already if it would be impossible to have a more expensive case */
  unsigned colored_done = lodepng_is_greyscale_type(mode_in) ? 1 : 0;
  unsigned alpha_done = lodepng_can_have_alpha(mode_in) ? 0 : 1;
  unsigned numcolors_done = 0;
  unsigned bpp = lodepng_get_bpp(mode_in);
  unsigned bits_done = (stats->bits == 1 && bpp == 1) ? 1 : 0;
  unsigned sixteen = 0; /* whether the input image is 16 bit */
  unsigned maxnumcolors = 257;
  if(bpp <= 8) maxnumcolors = LODEPNG_MIN(257, stats->numcolors + (1u << bpp));

  stats->numpixels += numpixels;

  /*if palette not allowed, no need to compute numcolors*/
  if(!stats->allow_palette) numcolors_done = 1;

  color_tree_init(&tree);

  /*If the stats was already filled in from previous data, fill its palette in tree
  and mark things as done already if we know they are the most expensive case already*/
  if(stats->alpha) alpha_done = 1;
  if(stats->colored) colored_done = 1;
  if(stats->bits == 16) numcolors_done = 1;
  if(stats->bits >= bpp) bits_done = 1;
  if(stats->numcolors >= maxnumcolors) numcolors_done = 1;

  if(!numcolors_done) {
    for(i = 0; i < stats->numcolors; i++) {
      const unsigned char* color = &stats->palette[i * 4];
      error = color_tree_add(&tree, color[0], color[1], color[2], color[3], i);
      if(error) goto cleanup;
    }
  }

  /*Check if the 16-bit input is truly 16-bit*/
  if(mode_in->bitdepth == 16 && !sixteen) {
    unsigned short r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i) {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      if((r & 255) != ((r >> 8) & 255) || (g & 255) != ((g >> 8) & 255) ||
         (b & 255) != ((b >> 8) & 255) || (a & 255) != ((a >> 8) & 255)) /*first and second byte differ*/ {
        stats->bits = 16;
        sixteen = 1;
        bits_done = 1;
        numcolors_done = 1; /*counting colors no longer useful, palette doesn't support 16-bit*/
        break;
      }
    }
  }

  if(sixteen) {
    unsigned short r = 0, g = 0, b = 0, a = 0;

    for(i = 0; i != numpixels; ++i) {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);

      if(!colored_done && (r != g || r != b)) {
        stats->colored = 1;
        colored_done = 1;
      }

      if(!alpha_done) {
        unsigned matchkey = (r == stats->key_r && g == stats->key_g && b == stats->key_b);
        if(a != 65535 && (a != 0 || (stats->key && !matchkey))) {
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        } else if(a == 0 && !stats->alpha && !stats->key) {
          stats->key = 1;
          stats->key_r = r;
          stats->key_g = g;
          stats->key_b = b;
        } else if(a == 65535 && stats->key && matchkey) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        }
      }
      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(stats->key && !stats->alpha) {
      for(i = 0; i != numpixels; ++i) {
        getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
        if(a != 0 && r == stats->key_r && g == stats->key_g && b == stats->key_b) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        }
      }
    }
  } else /* < 16-bit */ {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i) {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);

      if(!bits_done && stats->bits < 8) {
        /*only r is checked, < 8 bits is only relevant for grayscale*/
        unsigned bits = getValueRequiredBits(r);
        if(bits > stats->bits) stats->bits = bits;
      }
      bits_done = (stats->bits >= bpp);

      if(!colored_done && (r != g || r != b)) {
        stats->colored = 1;
        colored_done = 1;
        if(stats->bits < 8) stats->bits = 8; /*PNG has no colored modes with less than 8-bit per channel*/
      }

      if(!alpha_done) {
        unsigned matchkey = (r == stats->key_r && g == stats->key_g && b == stats->key_b);
        if(a != 255 && (a != 0 || (stats->key && !matchkey))) {
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if(stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        } else if(a == 0 && !stats->alpha && !stats->key) {
          stats->key = 1;
          stats->key_r = r;
          stats->key_g = g;
          stats->key_b = b;
        } else if(a == 255 && stats->key && matchkey) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if(stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }

      if(!numcolors_done) {
        if(!color_tree_has(&tree, r, g, b, a)) {
          error = color_tree_add(&tree, r, g, b, a, stats->numcolors);
          if(error) goto cleanup;
          if(stats->numcolors < 256) {
            unsigned char* p = stats->palette;
            unsigned n = stats->numcolors;
            p[n * 4 + 0] = r;
            p[n * 4 + 1] = g;
            p[n * 4 + 2] = b;
            p[n * 4 + 3] = a;
          }
          ++stats->numcolors;
          numcolors_done = stats->numcolors >= maxnumcolors;
        }
      }

      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(stats->key && !stats->alpha) {
      for(i = 0; i != numpixels; ++i) {
        getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
        if(a != 0 && r == stats->key_r && g == stats->key_g && b == stats->key_b) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if(stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }
    }

    /*make the stats's key always 16-bit for consistency - repeat each byte twice*/
    stats->key_r += (stats->key_r << 8);
    stats->key_g += (stats->key_g << 8);
    stats->key_b += (stats->key_b << 8);
  }

cleanup:
  color_tree_cleanup(&tree);
  return error;
}